

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QSet<QWidget_*> __thiscall QDockAreaLayoutInfo::usedSeparatorWidgets(QDockAreaLayoutInfo *this)

{
  int iVar1;
  long in_RSI;
  ulong uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  Data *local_30;
  
  local_30 = *(Data **)(in_FS_OFFSET + 0x28);
  this->sep = (int *)0x0;
  uVar4 = *(ulong *)(in_RSI + 0x18);
  iVar1 = (int)uVar4;
  QHash<QWidget_*,_QHashDummyValue>::reserve((QHash<QWidget_*,_QHashDummyValue> *)this,(long)iVar1);
  uVar2 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar1 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 * 8 != uVar2; uVar2 = uVar2 + 8) {
    QSet<QWidget_*>::operator<<
              ((QSet<QWidget_*> *)this,(QWidget **)(*(long *)(in_RSI + 0x10) + uVar2));
  }
  lVar3 = 8;
  for (uVar4 = 0; uVar4 < *(ulong *)(in_RSI + 0x50); uVar4 = uVar4 + 1) {
    if (*(long *)(*(long *)(in_RSI + 0x48) + lVar3) != 0) {
      usedSeparatorWidgets((QDockAreaLayoutInfo *)&stack0xffffffffffffffc8);
      QSet<QWidget_*>::unite((QSet<QWidget_*> *)this,(QSet<QWidget_*> *)&stack0xffffffffffffffc8);
      QHash<QWidget_*,_QHashDummyValue>::~QHash
                ((QHash<QWidget_*,_QHashDummyValue> *)&stack0xffffffffffffffc8);
    }
    lVar3 = lVar3 + 0x28;
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSet<QWidget_*>)(Hash)this;
  }
  __stack_chk_fail();
}

Assistant:

QSet<QWidget*> QDockAreaLayoutInfo::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparatorWidgets = separatorWidgets.size();
    result.reserve(numSeparatorWidgets);

    for (int i = 0; i < numSeparatorWidgets; ++i)
        result << separatorWidgets.at(i);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedSeparatorWidgets();
    }

    return result;
}